

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O0

bool __thiscall
re2::Prog::UnsafeSearchBacktrack
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  iterator pcVar2;
  iterator pcVar3;
  undefined1 local_298 [6];
  bool longest;
  bool anchored;
  Backtracker b;
  StringPiece sp0;
  StringPiece *match_local;
  MatchKind kind_local;
  Anchor anchor_local;
  StringPiece *context_local;
  StringPiece *text_local;
  Prog *this_local;
  
  StringPiece::StringPiece((StringPiece *)&b.nvisited_);
  sp0._8_8_ = match;
  match_local._4_4_ = anchor;
  if ((kind == kFullMatch) && (match_local._4_4_ = kAnchored, nmatch < 1)) {
    sp0._8_8_ = &b.nvisited_;
    nmatch = 1;
  }
  Backtracker::Backtracker((Backtracker *)local_298,this);
  bVar1 = Backtracker::Search((Backtracker *)local_298,text,context,match_local._4_4_ == kAnchored,
                              kind != kFirstMatch,(StringPiece *)sp0._8_8_,nmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      pcVar2 = StringPiece::end((StringPiece *)sp0._8_8_);
      pcVar3 = StringPiece::end(text);
      if (pcVar2 != pcVar3) {
        this_local._7_1_ = false;
        goto LAB_0015a967;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0015a967:
  Backtracker::~Backtracker((Backtracker *)local_298);
  return this_local._7_1_;
}

Assistant:

bool Prog::UnsafeSearchBacktrack(const StringPiece& text,
                                 const StringPiece& context,
                                 Anchor anchor,
                                 MatchKind kind,
                                 StringPiece* match,
                                 int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  Backtracker b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}